

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O0

void __thiscall
rest_rpc::rpc_client::async_call<0ul,std::__cxx11::string&>
          (rpc_client *this,string *rpc_name,
          function<void_(std::error_code,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>
          *cb,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  error_code __args;
  bool bVar1;
  undefined8 in_RDX;
  rpc_client *in_RDI;
  buffer_type ret;
  msgpack_codec codec;
  shared_ptr<rest_rpc::rpc_client::call_t> call;
  unique_lock<std::mutex> lock;
  uint64_t cb_id;
  mutex_type *in_stack_ffffffffffffff08;
  function<void_(std::error_code,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_ffffffffffffff10;
  char *string;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  function<void_(std::error_code,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_ffffffffffffff40;
  io_context *in_stack_ffffffffffffff48;
  call_t *in_stack_ffffffffffffff70;
  
  bVar1 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if (bVar1) {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    in_RDI->callback_id_ = in_RDI->callback_id_ + 1;
    *(byte *)((long)&in_RDI->callback_id_ + 7) = *(byte *)((long)&in_RDI->callback_id_ + 7) | 0x80;
    string = (char *)in_RDI->callback_id_;
    std::
    make_shared<rest_rpc::rpc_client::call_t,asio::io_context&,std::function<void(std::error_code,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>)>,unsigned_long>
              (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               (unsigned_long *)in_stack_ffffffffffffff38);
    std::__shared_ptr_access<rest_rpc::rpc_client::call_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<rest_rpc::rpc_client::call_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2ab1b5);
    call_t::start_timer(in_stack_ffffffffffffff70);
    std::
    unordered_map<unsigned_long,std::shared_ptr<rest_rpc::rpc_client::call_t>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<rest_rpc::rpc_client::call_t>>>>
    ::emplace<unsigned_long&,std::shared_ptr<rest_rpc::rpc_client::call_t>&>
              ((unordered_map<unsigned_long,_std::shared_ptr<rest_rpc::rpc_client::call_t>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<rest_rpc::rpc_client::call_t>_>_>_>
                *)in_stack_ffffffffffffff20,
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               (shared_ptr<rest_rpc::rpc_client::call_t> *)in_stack_ffffffffffffff10);
    std::shared_ptr<rest_rpc::rpc_client::call_t>::~shared_ptr
              ((shared_ptr<rest_rpc::rpc_client::call_t> *)0x2ab20a);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_ffffffffffffff10)
    ;
    rpc_service::msgpack_codec::msgpack_codec((msgpack_codec *)0x2ab221);
    rpc_service::msgpack_codec::pack_args<std::__cxx11::string&>(in_stack_ffffffffffffff38);
    std::__cxx11::string::data();
    MD5::MD5Hash32(string);
    write(in_RDI,(int)string,(void *)0x0,(size_t)&stack0xffffffffffffff38);
    msgpack::v1::sbuffer::~sbuffer((sbuffer *)0x2ab284);
    rpc_service::msgpack_codec::~msgpack_codec((msgpack_codec *)0x2ab28e);
  }
  else {
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(std::error_code,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>
                        *)0x2ab0c3);
    if (bVar1) {
      asio::error::make_error_code(0);
      nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff20,
                 (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      __args._M_cat = (error_category *)in_RDI;
      __args._0_8_ = in_RDX;
      __args_1.data_._4_4_ = in_stack_ffffffffffffff1c;
      __args_1.data_._0_4_ = in_stack_ffffffffffffff18;
      __args_1.size_ = (size_type)in_stack_ffffffffffffff20;
      std::
      function<void_(std::error_code,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>
      ::operator()(in_stack_ffffffffffffff10,__args,__args_1);
    }
  }
  return;
}

Assistant:

void async_call(const std::string &rpc_name,
                  std::function<void(asio::error_code, string_view)> cb,
                  Args &&...args) {
    if (!has_connected_) {
      if (cb)
        cb(asio::error::make_error_code(asio::error::not_connected),
           "not connected");
      return;
    }

    uint64_t cb_id = 0;
    {
      std::unique_lock<std::mutex> lock(cb_mtx_);
      callback_id_++;
      callback_id_ |= (uint64_t(1) << 63);
      cb_id = callback_id_;
      auto call = std::make_shared<call_t>(ios_, std::move(cb), TIMEOUT);
      call->start_timer();
      callback_map_.emplace(cb_id, call);
    }

    rpc_service::msgpack_codec codec;
    auto ret = codec.pack_args(std::forward<Args>(args)...);
    write(cb_id, request_type::req_res, std::move(ret),
          MD5::MD5Hash32(rpc_name.data()));
  }